

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeSorterFlushPMA(VdbeSorter *pSorter)

{
  SorterFile *ppFd;
  int *piVar1;
  sqlite3 *db;
  long lVar2;
  SorterRecord *pSVar3;
  int iVar4;
  int iVar5;
  sqlite3_file *psVar6;
  SorterRecord *p;
  u8 aByte [10];
  PmaWriter local_78;
  i64 *local_48;
  uchar local_3a [10];
  
  pSorter->bUsePMA = '\x01';
  db = (pSorter->aTask[0].pSorter)->db;
  psVar6 = pSorter->aTask[0].file.pFd;
  if (psVar6 == (sqlite3_file *)0x0) {
    ppFd = &pSorter->aTask[0].file;
    iVar4 = vdbeSorterOpenTempFile(db,0,&ppFd->pFd);
    if (iVar4 != 0) {
      return iVar4;
    }
    psVar6 = ppFd->pFd;
  }
  vdbeSorterExtendFile
            ((sqlite3 *)(ulong)(uint)db->nMaxSorterMmap,psVar6,
             pSorter->aTask[0].file.iEof + (long)(pSorter->list).szPMA + 9);
  iVar4 = vdbeSorterSort(pSorter->aTask,&pSorter->list);
  if (iVar4 == 0) {
    psVar6 = pSorter->aTask[0].file.pFd;
    iVar4 = (pSorter->aTask[0].pSorter)->pgsz;
    lVar2 = pSorter->aTask[0].file.iEof;
    local_78.iWriteOff = 0;
    local_78.pFd = (sqlite3_file *)0x0;
    local_78.nBuffer = 0;
    local_78.iBufStart = 0;
    local_78.iBufEnd = 0;
    local_78._28_4_ = 0;
    local_78.eFWErr = 0;
    local_78._4_4_ = 0;
    local_78.aBuffer = (u8 *)0x0;
    local_78.aBuffer = (u8 *)sqlite3Malloc((long)iVar4);
    if (local_78.aBuffer == (u8 *)0x0) {
      local_78.eFWErr = 7;
    }
    else {
      local_78.iWriteOff = lVar2 % (long)iVar4;
      iVar5 = (int)local_78.iWriteOff;
      local_78.iBufEnd = iVar5;
      local_78.iWriteOff = lVar2 - local_78.iWriteOff;
      local_78.iBufStart = iVar5;
      local_78.nBuffer = iVar4;
      local_78.pFd = psVar6;
    }
    local_48 = &pSorter->aTask[0].file.iEof;
    piVar1 = &pSorter->aTask[0].nPMA;
    *piVar1 = *piVar1 + 1;
    iVar4 = sqlite3PutVarint(local_3a,(long)(pSorter->list).szPMA);
    vdbePmaWriteBlob(&local_78,local_3a,iVar4);
    p = (pSorter->list).pList;
    if (p != (SorterRecord *)0x0) {
      do {
        pSVar3 = (p->u).pNext;
        iVar4 = sqlite3PutVarint(local_3a,(long)p->nVal);
        vdbePmaWriteBlob(&local_78,local_3a,iVar4);
        vdbePmaWriteBlob(&local_78,(u8 *)(p + 1),p->nVal);
        if ((pSorter->list).aMemory == (u8 *)0x0) {
          sqlite3_free(p);
        }
        p = pSVar3;
      } while (pSVar3 != (SorterRecord *)0x0);
    }
    (pSorter->list).pList = (SorterRecord *)0x0;
    iVar4 = vdbePmaWriterFinish(&local_78,local_48);
  }
  return iVar4;
}

Assistant:

static int vdbeSorterFlushPMA(VdbeSorter *pSorter){
#if SQLITE_MAX_WORKER_THREADS==0
  pSorter->bUsePMA = 1;
  return vdbeSorterListToPMA(&pSorter->aTask[0], &pSorter->list);
#else
  int rc = SQLITE_OK;
  int i;
  SortSubtask *pTask = 0;    /* Thread context used to create new PMA */
  int nWorker = (pSorter->nTask-1);

  /* Set the flag to indicate that at least one PMA has been written. 
  ** Or will be, anyhow.  */
  pSorter->bUsePMA = 1;

  /* Select a sub-task to sort and flush the current list of in-memory
  ** records to disk. If the sorter is running in multi-threaded mode,
  ** round-robin between the first (pSorter->nTask-1) tasks. Except, if
  ** the background thread from a sub-tasks previous turn is still running,
  ** skip it. If the first (pSorter->nTask-1) sub-tasks are all still busy,
  ** fall back to using the final sub-task. The first (pSorter->nTask-1)
  ** sub-tasks are prefered as they use background threads - the final 
  ** sub-task uses the main thread. */
  for(i=0; i<nWorker; i++){
    int iTest = (pSorter->iPrev + i + 1) % nWorker;
    pTask = &pSorter->aTask[iTest];
    if( pTask->bDone ){
      rc = vdbeSorterJoinThread(pTask);
    }
    if( rc!=SQLITE_OK || pTask->pThread==0 ) break;
  }

  if( rc==SQLITE_OK ){
    if( i==nWorker ){
      /* Use the foreground thread for this operation */
      rc = vdbeSorterListToPMA(&pSorter->aTask[nWorker], &pSorter->list);
    }else{
      /* Launch a background thread for this operation */
      u8 *aMem = pTask->list.aMemory;
      void *pCtx = (void*)pTask;

      assert( pTask->pThread==0 && pTask->bDone==0 );
      assert( pTask->list.pList==0 );
      assert( pTask->list.aMemory==0 || pSorter->list.aMemory!=0 );

      pSorter->iPrev = (u8)(pTask - pSorter->aTask);
      pTask->list = pSorter->list;
      pSorter->list.pList = 0;
      pSorter->list.szPMA = 0;
      if( aMem ){
        pSorter->list.aMemory = aMem;
        pSorter->nMemory = sqlite3MallocSize(aMem);
      }else if( pSorter->list.aMemory ){
        pSorter->list.aMemory = sqlite3Malloc(pSorter->nMemory);
        if( !pSorter->list.aMemory ) return SQLITE_NOMEM_BKPT;
      }

      rc = vdbeSorterCreateThread(pTask, vdbeSorterFlushThread, pCtx);
    }
  }

  return rc;
#endif /* SQLITE_MAX_WORKER_THREADS!=0 */
}